

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O0

void kv_set_var_nentry_update_test(btree_kv_ops *kv_ops)

{
  char *pcVar1;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var2;
  void *pvVar3;
  char *pcVar4;
  bnode *pbVar5;
  int iVar6;
  size_t sVar7;
  char **ppcVar8;
  char *local_148;
  uint16_t in_stack_fffffffffffffec4;
  uint8_t in_stack_fffffffffffffec6;
  uint8_t in_stack_fffffffffffffec7;
  char *pcStack_100;
  char **key;
  size_t offset;
  uint8_t vsize;
  uint uStack_78;
  uint8_t ksize;
  int n;
  int i;
  uint8_t v;
  bnoderef node;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  btree_kv_ops *kv_ops_local;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  key = (char **)0x0;
  _i = dummy_node(in_stack_fffffffffffffec7,in_stack_fffffffffffffec6,in_stack_fffffffffffffec4);
  _i->nentry = 10;
  n._3_1_ = 100;
  uStack_78 = 0;
  ppcVar8 = &local_148;
  do {
    if (9 < (int)uStack_78) {
      key = (char **)0x0;
      uStack_78 = 0;
      do {
        pbVar5 = _i;
        if (9 < (int)uStack_78) {
          p_Var2 = kv_ops->set_kv;
          ppcVar8[-1] = (char *)0x1022d2;
          (*p_Var2)(pbVar5,9,local_148,(void *)((long)&n + 3));
          ppcVar8[-1] = (char *)0x1022f5;
          strcpy(local_148,pcStack_100);
          pbVar5 = _i;
          p_Var2 = kv_ops->set_kv;
          ppcVar8[-1] = (char *)0x10231d;
          (*p_Var2)(pbVar5,0,pcStack_100,(void *)((long)&n + 3));
          ppcVar8[-1] = (char *)0x10233d;
          strcpy(pcStack_100,"key0");
          key = (char **)0x0;
          uStack_78 = 0;
          do {
            pbVar5 = _i;
            if (9 < (int)uStack_78) {
              ppcVar8[-1] = (char *)0x10252f;
              free(pbVar5);
              ppcVar8[-1] = (char *)0x102534;
              memleak_end();
              if (kv_set_var_nentry_update_test::__test_pass == 0) {
                ppcVar8[-1] = (char *)0x10257d;
                fprintf(_stderr,"%s FAILED\n","kv_set_var_nentry_update_test");
              }
              else {
                ppcVar8[-1] = (char *)0x10255c;
                fprintf(_stderr,"%s PASSED\n","kv_set_var_nentry_update_test");
              }
              return;
            }
            pvVar3 = (_i->field_4).data;
            pcVar1 = (&local_148)[(int)uStack_78];
            pcVar4 = (&local_148)[(int)uStack_78];
            ppcVar8[-1] = (char *)0x102395;
            sVar7 = strlen(pcVar4);
            ppcVar8[-1] = (char *)0x1023ab;
            iVar6 = memcmp((void *)((long)pvVar3 + (long)key),pcVar1,sVar7);
            if (iVar6 != 0) {
              ppcVar8[-1] = (char *)0x1023d8;
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                      ,0xec);
              kv_set_var_nentry_update_test::__test_pass = 0;
              pvVar3 = (_i->field_4).data;
              pcVar1 = (&local_148)[(int)uStack_78];
              pcVar4 = (&local_148)[(int)uStack_78];
              ppcVar8[-1] = (char *)0x10241f;
              sVar7 = strlen(pcVar4);
              ppcVar8[-1] = (char *)0x102435;
              iVar6 = memcmp((void *)((long)pvVar3 + (long)key),pcVar1,sVar7);
              if (iVar6 != 0) {
                ppcVar8[-1] = (char *)0x102464;
                __assert_fail("!memcmp((uint8_t *)node->data + offset, key[i], strlen(key[i]))",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                              ,0xec,"void kv_set_var_nentry_update_test(btree_kv_ops *)");
              }
            }
            pvVar3 = (_i->field_4).data;
            ppcVar8[-1] = (char *)0x10248d;
            iVar6 = memcmp((void *)((long)pvVar3 + (long)(key + 1)),(void *)((long)&n + 3),1);
            if (iVar6 != 0) {
              ppcVar8[-1] = (char *)0x1024b6;
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                      ,0xee);
              kv_set_var_nentry_update_test::__test_pass = 0;
              pvVar3 = (_i->field_4).data;
              ppcVar8[-1] = (char *)0x1024db;
              iVar6 = memcmp((void *)((long)pvVar3 + (long)(key + 1)),(void *)((long)&n + 3),1);
              if (iVar6 != 0) {
                ppcVar8[-1] = (char *)0x10250a;
                __assert_fail("!memcmp((uint8_t *)node->data + offset, &v, vsize)",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                              ,0xee,"void kv_set_var_nentry_update_test(btree_kv_ops *)");
              }
            }
            key = (char **)((long)key + 9);
            uStack_78 = uStack_78 + 1;
          } while( true );
        }
        p_Var2 = kv_ops->set_kv;
        pcVar1 = (&local_148)[(int)uStack_78];
        ppcVar8[-1] = (char *)0x1020dc;
        (*p_Var2)(pbVar5,(idx_t)uStack_78,pcVar1,(void *)((long)&n + 3));
        pvVar3 = (_i->field_4).data;
        pcVar1 = (&local_148)[(int)uStack_78];
        pcVar4 = (&local_148)[(int)uStack_78];
        ppcVar8[-1] = (char *)0x102119;
        sVar7 = strlen(pcVar4);
        ppcVar8[-1] = (char *)0x10212f;
        iVar6 = memcmp((void *)((long)pvVar3 + (long)key),pcVar1,sVar7);
        if (iVar6 != 0) {
          ppcVar8[-1] = (char *)0x10215c;
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                  ,0xd9);
          kv_set_var_nentry_update_test::__test_pass = 0;
          pvVar3 = (_i->field_4).data;
          pcVar1 = (&local_148)[(int)uStack_78];
          pcVar4 = (&local_148)[(int)uStack_78];
          ppcVar8[-1] = (char *)0x1021a3;
          sVar7 = strlen(pcVar4);
          ppcVar8[-1] = (char *)0x1021b9;
          iVar6 = memcmp((void *)((long)pvVar3 + (long)key),pcVar1,sVar7);
          if (iVar6 != 0) {
            ppcVar8[-1] = (char *)0x1021e8;
            __assert_fail("!memcmp((uint8_t *)node->data + offset, key[i], strlen(key[i]))",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                          ,0xd9,"void kv_set_var_nentry_update_test(btree_kv_ops *)");
          }
        }
        pvVar3 = (_i->field_4).data;
        ppcVar8[-1] = (char *)0x102211;
        iVar6 = memcmp((void *)((long)pvVar3 + (long)(key + 1)),(void *)((long)&n + 3),1);
        if (iVar6 != 0) {
          ppcVar8[-1] = (char *)0x10223a;
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                  ,0xdb);
          kv_set_var_nentry_update_test::__test_pass = 0;
          pvVar3 = (_i->field_4).data;
          ppcVar8[-1] = (char *)0x10225f;
          iVar6 = memcmp((void *)((long)pvVar3 + (long)(key + 1)),(void *)((long)&n + 3),1);
          if (iVar6 != 0) {
            ppcVar8[-1] = (char *)0x10228e;
            __assert_fail("!memcmp((uint8_t *)node->data + offset, &v, vsize)",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                          ,0xdb,"void kv_set_var_nentry_update_test(btree_kv_ops *)");
          }
        }
        key = (char **)((long)key + 9);
        uStack_78 = uStack_78 + 1;
      } while( true );
    }
    (&local_148)[(int)uStack_78] = (char *)(ppcVar8 + -2);
    pcVar1 = (&local_148)[(int)uStack_78];
    ppcVar8[-3] = (char *)0x101e9f;
    sprintf(pcVar1,"key%d",(ulong)uStack_78);
    pbVar5 = _i;
    p_Var2 = kv_ops->set_kv;
    pcVar1 = (&local_148)[(int)uStack_78];
    ppcVar8[-3] = (char *)0x101ec9;
    (*p_Var2)(pbVar5,(idx_t)uStack_78,pcVar1,(void *)((long)&n + 3));
    pvVar3 = (_i->field_4).data;
    pcVar1 = (&local_148)[(int)uStack_78];
    pcVar4 = (&local_148)[(int)uStack_78];
    ppcVar8[-3] = (char *)0x101f06;
    sVar7 = strlen(pcVar4);
    ppcVar8[-3] = (char *)0x101f1c;
    iVar6 = memcmp((void *)((long)pvVar3 + (long)key),pcVar1,sVar7);
    if (iVar6 != 0) {
      ppcVar8[-3] = (char *)0x101f49;
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
              ,0xcc);
      kv_set_var_nentry_update_test::__test_pass = 0;
      pvVar3 = (_i->field_4).data;
      pcVar1 = (&local_148)[(int)uStack_78];
      pcVar4 = (&local_148)[(int)uStack_78];
      ppcVar8[-3] = (char *)0x101f90;
      sVar7 = strlen(pcVar4);
      ppcVar8[-3] = (char *)0x101fa6;
      iVar6 = memcmp((void *)((long)pvVar3 + (long)key),pcVar1,sVar7);
      if (iVar6 != 0) {
        ppcVar8[-3] = (char *)0x101fd5;
        __assert_fail("!memcmp((uint8_t *)node->data + offset, key[i], strlen(key[i]))",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                      ,0xcc,"void kv_set_var_nentry_update_test(btree_kv_ops *)");
      }
    }
    pvVar3 = (_i->field_4).data;
    ppcVar8[-3] = (char *)0x101ffe;
    iVar6 = memcmp((void *)((long)pvVar3 + (long)(key + 1)),(void *)((long)&n + 3),1);
    if (iVar6 != 0) {
      ppcVar8[-3] = (char *)0x102027;
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
              ,0xce);
      kv_set_var_nentry_update_test::__test_pass = 0;
      pvVar3 = (_i->field_4).data;
      ppcVar8[-3] = (char *)0x10204c;
      iVar6 = memcmp((void *)((long)pvVar3 + (long)(key + 1)),(void *)((long)&n + 3),1);
      if (iVar6 != 0) {
        ppcVar8[-3] = (char *)0x10207b;
        __assert_fail("!memcmp((uint8_t *)node->data + offset, &v, vsize)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                      ,0xce,"void kv_set_var_nentry_update_test(btree_kv_ops *)");
      }
    }
    key = (char **)((long)key + 9);
    uStack_78 = uStack_78 + 1;
    ppcVar8 = ppcVar8 + -2;
  } while( true );
}

Assistant:

void kv_set_var_nentry_update_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    uint8_t v;
    int i, n = 10;
    uint8_t ksize = 8;
    uint8_t vsize = sizeof(v);
    size_t offset = 0;
    char **key = alca(char*, n);

    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;

    // first pass
    for (i = 0; i < n; i++) {
        key[i] = alca(char, ksize);
        sprintf(key[i], "key%d", i);
        kv_ops->set_kv(node, i, key[i], (void *)&v);

        TEST_CHK(!memcmp((uint8_t *)node->data + offset, key[i], strlen(key[i])));
        offset += ksize;
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, &v, vsize));
        offset += vsize;

    }

    offset = 0;

    // second pass
    for (i = 0; i < n; i++) {

        kv_ops->set_kv(node, i, key[i], (void *)&v);
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, key[i], strlen(key[i])));
        offset += ksize;
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, &v, vsize));
        offset += vsize;
    }

    /* swap first/last entries */

    // copy first key to last
    kv_ops->set_kv(node, n-1, key[0], (void *)&v);
    strcpy(key[0], key[n-1]);

    // copy last key to first
    kv_ops->set_kv(node, 0, key[n-1], (void *)&v);
    strcpy(key[n-1], "key0");

    // verify
    offset = 0;
    for (i = 0; i < n; i++) {
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, key[i], strlen(key[i])));
        offset += ksize;
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, &v, vsize));
        offset += vsize;
    }

    free(node);
    memleak_end();
    TEST_RESULT("kv_set_var_nentry_update_test");
}